

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O2

void __thiscall
burst::
difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
::maintain_invariant
          (difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
           *this)

{
  int *piVar1;
  int *piVar2;
  
  while ((piVar1 = (this->m_subtrahend_begin)._M_current,
         piVar1 != (this->m_subtrahend_end)._M_current &&
         (piVar2 = (this->m_minuend_begin)._M_current, piVar2 != (this->m_minuend_end)._M_current)))
  {
    if (*piVar2 < *piVar1) {
      return;
    }
    if (*piVar2 <= *piVar1) {
      (this->m_minuend_begin)._M_current = piVar2 + 1;
      (this->m_subtrahend_begin)._M_current = piVar1 + 1;
    }
    drop_subtrahend_head(this);
  }
  return;
}

Assistant:

void maintain_invariant ()
        {
            while (m_subtrahend_begin != m_subtrahend_end
                && m_minuend_begin != m_minuend_end
                && not m_compare(*m_minuend_begin, *m_subtrahend_begin))
            {
                if (not m_compare(*m_subtrahend_begin, *m_minuend_begin))
                {
                    ++m_minuend_begin;
                    ++m_subtrahend_begin;
                }
                drop_subtrahend_head();
            }
        }